

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void __thiscall DataSet::load(DataSet *this,string *filepath,uint ignored_lines,bool auto_read)

{
  value_type vVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  istream *piVar5;
  char *pcVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  double dVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar11;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_628;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_620;
  const_iterator local_618;
  allocator<double> local_609;
  undefined1 local_608 [8];
  vector<double,_std::allocator<double>_> out;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_5e0;
  _Self local_5b8;
  _Self local_5b0;
  undefined4 local_5a4;
  stringstream local_5a0 [8];
  stringstream stream_1;
  ostream local_590 [376];
  double local_418;
  double val;
  vector<double,_std::allocator<double>_> inputs;
  uint local_3f0;
  uint word_count;
  uint n_lines;
  uint j;
  uint i;
  uint dims [2];
  long local_3d0;
  ifstream file;
  undefined1 local_1c8 [8];
  string line;
  stringstream stream;
  ostream local_198 [379];
  byte local_1d;
  uint local_1c;
  bool auto_read_local;
  string *psStack_18;
  uint ignored_lines_local;
  string *filepath_local;
  DataSet *this_local;
  
  local_1d = auto_read;
  local_1c = ignored_lines;
  psStack_18 = filepath;
  filepath_local = (string *)this;
  std::__cxx11::string::operator=((string *)&this->m_filePath,(string *)filepath);
  std::__cxx11::stringstream::stringstream((stringstream *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_1c8);
  std::ifstream::ifstream(&local_3d0,psStack_18,8);
  bVar2 = std::ios::operator!((ios *)((long)&local_3d0 + *(long *)(local_3d0 + -0x18)));
  if ((bVar2 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"ERROR [load file]: Couldn\'t load the dataset file!\n");
    exit(1);
  }
  n_lines = 0;
  word_count = 0;
  local_3f0 = 0;
  inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&val);
  if ((local_1c == 0) && ((local_1d & 1) == 0)) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_3d0,(string *)local_1c8);
    std::operator<<(local_198,(string *)local_1c8);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),(string *)local_1c8,',');
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar3) break;
      uVar4 = std::__cxx11::stoi((string *)local_1c8,(size_t *)0x0,10);
      (&j)[n_lines] = uVar4;
      n_lines = n_lines + 1;
    }
    Matrix::set_shape(&this->m_inputSet,j,i - 1);
    Matrix::set_shape(&this->m_outputSet,j,1);
    std::ios::clear((long)&line.field_2 + *(long *)(line.field_2._8_8_ + -0x18) + 8,0);
  }
  n_lines = 0;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_3d0,(string *)local_1c8);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar3) break;
    std::__cxx11::stringstream::stringstream(local_5a0);
    std::operator<<(local_590,(string *)local_1c8);
    local_3f0 = local_3f0 + 1;
    if (local_1c < local_3f0) {
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_5a0,(string *)local_1c8,',');
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar3) break;
        if ((local_1d & 1) == 0) {
          if (word_count < i - 1) {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            dVar10 = strtod(pcVar6,(char **)0x0);
            pvVar7 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)this,(ulong)n_lines);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar7,(ulong)word_count);
            *pvVar9 = dVar10;
            word_count = word_count + 1;
          }
          else {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            dVar10 = strtod(pcVar6,(char **)0x0);
            pvVar7 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&(this->m_outputSet).m_vals,(ulong)n_lines);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,0);
            *pvVar9 = dVar10;
            word_count = 0;
            n_lines = n_lines + 1;
          }
        }
        else {
          bVar3 = is_word((string *)local_1c8);
          if (bVar3) {
            local_5b0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&this->m_map,(key_type *)local_1c8);
            local_5b8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::end(&this->m_map);
            bVar3 = std::operator==(&local_5b0,&local_5b8);
            if (bVar3) {
              inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ =
                   inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int_&,_true>
                        (&local_5e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c8,
                         (uint *)((long)&inputs.super__Vector_base<double,_std::allocator<double>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
              pVar11 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::insert(&this->m_map,&local_5e0);
              out.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)pVar11.first._M_node;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              ::~pair(&local_5e0);
            }
            local_418 = (double)(inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_ - 1);
          }
          else {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            local_418 = strtod(pcVar6,(char **)0x0);
          }
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)&val,&local_418);
        }
      }
      if (((local_1d & 1) != 0) && (local_1c < local_3f0)) {
        std::allocator<double>::allocator(&local_609);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_608,1,&local_609);
        std::allocator<double>::~allocator(&local_609);
        sVar8 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)&val);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&val,sVar8 - 1);
        vVar1 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_608,0);
        *pvVar9 = vVar1;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&(this->m_outputSet).m_vals,(vector<double,_std::allocator<double>_> *)local_608
                   );
        local_628._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)&val);
        local_620 = __gnu_cxx::
                    __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                    operator-(&local_628,1);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_618,&local_620);
        std::vector<double,_std::allocator<double>_>::erase
                  ((vector<double,_std::allocator<double>_> *)&val,local_618);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)this,(value_type *)&val);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)&val);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_608);
      }
      local_5a4 = 0;
    }
    else {
      local_5a4 = 4;
    }
    std::__cxx11::stringstream::~stringstream(local_5a0);
  }
  update(this);
  std::ifstream::close();
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&val);
  std::ifstream::~ifstream(&local_3d0);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(line.field_2._M_local_buf + 8));
  return;
}

Assistant:

void DataSet::load(const std::string& filepath, uint ignored_lines, bool auto_read){
    m_filePath=filepath;

    std::stringstream stream;
    std::string line;
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [load file]: Couldn't load the dataset file!\n";
        exit(1);
    }

    uint dims[2], i=0, j=0, n_lines=0, word_count=0;
    std::vector<double> inputs;
    double val;

    if(!ignored_lines && !auto_read){
        std::getline(file, line);
        stream<<line;
        // std::cout<<" dbg first line: "<<line<<'\n';
        while(std::getline(stream, line, ',')){
            // std::cout<<" dbg token: "<<line<<'\n';
            dims[i++]=std::stoi(line);
            // std::cout<<" dims #"<<i-1<<": "<<dims[i-1]<<'\n';
        }
        // std::cout<<" dbg parsed\n";
        m_inputSet.set_shape(dims[0], dims[1]-1);
        m_outputSet.set_shape(dims[0], 1);
        i=0;
        stream.clear();
    }

    // std::cout<<" dbg dims: "<<dims[0]<<", "<<dims[1]<<'\n';
    // std::cout<<" dbg input shape: "<<m_inputSet.shape()<<"; output shape: "<<m_outputSet.shape()<<'\n';

    while(std::getline(file, line)){
        std::stringstream stream;
        stream<<line;
        // std::cout<<" dbg auto-reading line: "<<stream.str()<<"\n";
        if(ignored_lines>=++n_lines) continue;
        while(std::getline(stream, line, ',')){
            if(auto_read){
                // std::cout<<" > "<<line;
                if(is_word(line)){
                    // std::cout<<" +\n";
                    if(m_map.find(line)==m_map.end()){
                        // std::cout<<"Not Found!\n";
                        m_map.insert({line, ++word_count});
                    }
                    val=word_count-1;
                }
                else{
                    // std::cout<<" -\n";
                    val=strtod(line.c_str(), nullptr);
                }
                inputs.push_back(val);
            }
            else{
                if(j<dims[1]-1){
                    // std::cout<<" dbg writing inputSet\n";
                    m_inputSet.m_vals[i][j++]=strtod(line.c_str(), nullptr);
                }
                else{
                    // std::cout<<" dbg writing outputSet\n";
                    m_outputSet.m_vals[i++][0]=strtod(line.c_str(), nullptr);
                    j=0;
                }
            }
        }
        // std::cout<<"\nClearing stream\n";
        if(auto_read && ignored_lines<n_lines){
            // std::cout<<" > pushing the data back\n";
            std::vector<double> out(1);
            out[0]=inputs[inputs.size()-1];
            m_outputSet.m_vals.push_back(out);
            inputs.erase(inputs.end()-1);
            m_inputSet.m_vals.push_back(inputs);
            inputs.clear();
        }
        // stream.clear();
    }

    update();
    file.close();
}